

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::HighFunction::eval
          (HighFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  bitwidth_t bVar2;
  int32_t iVar3;
  ConstantValue *in_RDI;
  DimResult dim;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Type *in_stack_fffffffffffffee0;
  ConstantValue *pCVar4;
  Type *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffef4;
  ConstantValue local_e8;
  undefined4 local_b0;
  long local_48;
  byte local_38;
  byte local_37;
  byte local_36;
  
  pCVar4 = in_RDI;
  ArrayQueryFunction::getDim
            ((ArrayQueryFunction *)
             dim.map.defaultValue.value.
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             ._M_u._0_8_,
             (EvalContext *)
             dim.map.
             super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Args *)dim.map.
                     super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                     ._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  if ((local_38 & 1) == 0) {
    if ((local_36 & 1) == 0) {
      if ((local_37 & 1) == 0) {
        if (local_48 == 0) {
          iVar3 = ConstantRange::upper((ConstantRange *)0x97a113);
          SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (bitwidth_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (uint64_t)in_stack_fffffffffffffee0,SUB41((uint)iVar3 >> 0x18,0));
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffee0,
                     (SVInt *)CONCAT44(iVar3,in_stack_fffffffffffffed8));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        }
        else {
          bVar1 = std::
                  map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                  ::empty((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                           *)0x97a032);
          if (bVar1) {
            bVar2 = Type::getBitWidth(in_stack_fffffffffffffee8);
            bVar1 = Type::isSigned(in_stack_fffffffffffffee0);
            uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef0);
            SVInt::createFillX((bitwidth_t)((ulong)pCVar4 >> 0x20),SUB81((ulong)pCVar4 >> 0x18,0));
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffffee0,
                       (SVInt *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
            SVInt::~SVInt((SVInt *)CONCAT44(bVar2,uVar5));
          }
          else {
            pCVar4 = &local_e8;
            std::
            map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
            ::rbegin((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
            std::
            reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
            ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                          *)pCVar4);
            slang::ConstantValue::ConstantValue
                      (pCVar4,(ConstantValue *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          }
        }
      }
      else {
        SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (bitwidth_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffee0,
                     SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0));
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffee0,
                   (SVInt *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
    }
    else {
      SVInt::createFillX((bitwidth_t)((ulong)pCVar4 >> 0x20),SUB81((ulong)pCVar4 >> 0x18,0));
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffee0,
                 (SVInt *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffee0,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  local_b0 = 1;
  ArrayQueryFunction::DimResult::~DimResult((DimResult *)0x97a185);
  return in_RDI;
}

Assistant:

ConstantValue HighFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                 const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic)
        return SVInt(32, uint64_t(dim.range.right), true);

    // For associative arrays, $high returns the last key, or 'x if no elements.
    if (dim.indexType) {
        if (dim.map.empty())
            return SVInt::createFillX(dim.indexType->getBitWidth(), dim.indexType->isSigned());
        return dim.map.rbegin()->first;
    }

    return SVInt(32, uint64_t(dim.range.upper()), true);
}